

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner::openStream(Runner *this)

{
  Config *pCVar1;
  ostream *poVar2;
  domain_error *this_00;
  string local_1b0 [32];
  ostringstream oss;
  
  pCVar1 = (this->m_config).m_p;
  if ((pCVar1->m_data).outputFilename._M_string_length == 0) {
    return;
  }
  std::ofstream::open((char *)&this->m_ofs,
                      (_Ios_Openmode)(pCVar1->m_data).outputFilename._M_dataplus._M_p);
  if (((&this->field_0x28)[*(long *)(*(long *)&this->m_ofs + -0x18)] & 5) == 0) {
    Config::setStreamBuf((this->m_config).m_p,(streambuf *)&this->field_0x10);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Unable to open file: \'");
  poVar2 = std::operator<<(poVar2,(string *)&(((this->m_config).m_p)->m_data).outputFilename);
  std::operator<<(poVar2,"\'");
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

T* operator->() const { return m_p; }